

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

Abc_Cex_t * Fra_SmlGetCounterExample(Fra_Sml_t *p)

{
  int i;
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  ulong uVar3;
  Abc_Cex_t *p_00;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  Aig_Man_t *pAVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int local_48;
  
  if (p->fNonConstOut == 0) {
    __assert_fail("p->fNonConstOut",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x41b,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  local_48 = -1;
  for (iVar8 = 0; pAVar7 = p->pAig, iVar8 < pAVar7->nObjs[3] - pAVar7->nRegs; iVar8 = iVar8 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar7->vCos,iVar8);
    iVar1 = Fra_SmlNodeIsZero(p,pObj);
    if (iVar1 == 0) {
      uVar3 = (ulong)p->nWordsPref;
      goto LAB_00504752;
    }
  }
LAB_00504763:
  iVar1 = -1;
LAB_0050478c:
  pAVar7 = p->pAig;
  iVar9 = pAVar7->nRegs;
  if (pAVar7->nObjs[3] - iVar9 <= iVar8) {
    __assert_fail("iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x42f,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  if (p->nFrames <= local_48) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x430,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  if (p->nWordsFrame * 0x20 <= iVar1) {
    __assert_fail("iBit < 32 * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x431,"Abc_Cex_t *Fra_SmlGetCounterExample(Fra_Sml_t *)");
  }
  p_00 = Abc_CexAlloc(iVar9,pAVar7->nObjs[2] - iVar9,local_48 + 1);
  p_00->iPo = iVar8;
  p_00->iFrame = local_48;
  pAVar7 = p->pAig;
  uVar10 = 1 << ((byte)iVar1 & 0x1f);
  for (iVar8 = pAVar7->nObjs[2] - pAVar7->nRegs; iVar8 < pAVar7->vCis->nSize; iVar8 = iVar8 + 1) {
    pvVar4 = Vec_PtrEntry(pAVar7->vCis,iVar8);
    if ((*(uint *)((long)&p[1].pAig +
                  (long)p->nWordsTotal * (long)*(int *)((long)pvVar4 + 0x24) * 4 +
                  (long)(iVar1 >> 5) * 4) & uVar10) != 0) {
      (&p_00[1].iPo)[iVar8 >> 5] = (&p_00[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
    }
    pAVar7 = p->pAig;
  }
  for (iVar8 = 0; iVar8 <= local_48; iVar8 = iVar8 + 1) {
    for (iVar9 = 0; iVar9 < pAVar7->nObjs[2] - pAVar7->nRegs; iVar9 = iVar9 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar7->vCis,iVar9);
      if ((*(uint *)((long)&p[1].pAig +
                    (long)(p->nWordsFrame * iVar8 * 0x20 + iVar1 >> 5) * 4 +
                    (long)p->nWordsTotal * (long)*(int *)((long)pvVar4 + 0x24) * 4) & uVar10) != 0)
      {
        iVar5 = p_00->nPis * iVar8 + p_00->nRegs + iVar9;
        (&p_00[1].iPo)[iVar5 >> 5] = (&p_00[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
      }
      pAVar7 = p->pAig;
    }
  }
  iVar8 = Saig_ManVerifyCex(pAVar7,p_00);
  if (iVar8 == 0) {
    puts("Fra_SmlGetCounterExample(): Counter-example is invalid.");
    Abc_CexFree(p_00);
    p_00 = (Abc_Cex_t *)0x0;
  }
  return p_00;
LAB_00504752:
  if ((long)p->nWordsTotal <= (long)uVar3) goto LAB_00504763;
  uVar10 = *(uint *)((long)&p[1].pAig + uVar3 * 4 + (long)(pObj->Id * p->nWordsTotal) * 4);
  if (uVar10 != 0) {
    uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
    local_48 = (int)((long)uVar3 / (long)p->nWordsFrame);
    for (uVar2 = 0;
        (uVar6 = 0xffffffff, uVar2 != 0x20 && (uVar6 = uVar2, (uVar10 >> (uVar2 & 0x1f) & 1) == 0));
        uVar2 = uVar2 + 1) {
    }
    iVar1 = uVar6 + (int)((long)uVar3 % (long)p->nWordsFrame) * 0x20;
    goto LAB_0050478c;
  }
  uVar3 = uVar3 + 1;
  goto LAB_00504752;
}

Assistant:

Abc_Cex_t * Fra_SmlGetCounterExample( Fra_Sml_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int iPo, iFrame, iBit, i, k;

    // make sure the simulation manager has it
    assert( p->fNonConstOut );

    // find the first output that failed
    iPo = -1;
    iBit = -1;
    iFrame = -1;
    Aig_ManForEachPoSeq( p->pAig, pObj, iPo )
    {
        if ( Fra_SmlNodeIsZero(p, pObj) )
            continue;
        pSims = Fra_ObjSim( p, pObj->Id );
        for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
            if ( pSims[i] )
            {
                iFrame = i / p->nWordsFrame;
                iBit = 32 * (i % p->nWordsFrame) + Aig_WordFindFirstBit( pSims[i] );
                break;
            }
        break;
    }
    assert( iPo < Aig_ManCoNum(p->pAig)-Aig_ManRegNum(p->pAig) );
    assert( iFrame < p->nFrames );
    assert( iBit < 32 * p->nWordsFrame );

    // allocate the counter example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig), iFrame + 1 );
    pCex->iPo    = iPo;
    pCex->iFrame = iFrame;

    // copy the bit data
    Aig_ManForEachLoSeq( p->pAig, pObj, k )
    {
        pSims = Fra_ObjSim( p, pObj->Id );
        if ( Abc_InfoHasBit( pSims, iBit ) )
            Abc_InfoSetBit( pCex->pData, k );
    }
    for ( i = 0; i <= iFrame; i++ )
    {
        Aig_ManForEachPiSeq( p->pAig, pObj, k )
        {
            pSims = Fra_ObjSim( p, pObj->Id );
            if ( Abc_InfoHasBit( pSims, 32 * p->nWordsFrame * i + iBit ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + pCex->nPis * i + k );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Fra_SmlGetCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}